

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::first_non_empty_span(basic_substring<const_char> *this)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  size_t sVar4;
  basic_substring<const_char> bVar5;
  ro_substr chars;
  ro_substr chars_00;
  basic_substring<const_char> ret;
  basic_substring<const_char> local_30;
  basic_substring<const_char> local_20;
  
  chars.len = 4;
  chars.str = " \n\r\t";
  sVar4 = first_not_of(this,chars,0);
  if (sVar4 == 0xffffffffffffffff) {
    local_30.str = this->str;
    local_30.len = 0;
  }
  else {
    if (this->len < sVar4) {
      eVar3 = get_error_flags();
      if ((eVar3 & 1) != 0) {
        bVar2 = is_debugger_attached();
        if (bVar2) {
          pcVar1 = (code *)swi(3);
          bVar5 = (basic_substring<const_char>)(*pcVar1)();
          return bVar5;
        }
      }
      handle_error(0x21a325,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring(&local_30,this->str + sVar4,this->len - sVar4);
    local_20.str = local_30.str;
    local_20.len = local_30.len;
    chars_00.len = 4;
    chars_00.str = " \n\r\t";
    sVar4 = first_of(&local_20,chars_00,0);
    if ((sVar4 != 0xffffffffffffffff) && (local_20.len < sVar4)) {
      eVar3 = get_error_flags();
      if ((eVar3 & 1) != 0) {
        bVar2 = is_debugger_attached();
        if (bVar2) {
          pcVar1 = (code *)swi(3);
          bVar5 = (basic_substring<const_char>)(*pcVar1)();
          return bVar5;
        }
      }
      handle_error(0x21a325,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x154e,"num <= len || num == npos");
    }
    if (sVar4 == 0xffffffffffffffff) {
      sVar4 = local_20.len;
    }
    basic_substring(&local_30,local_20.str,sVar4);
  }
  bVar5.len = local_30.len;
  bVar5.str = local_30.str;
  return bVar5;
}

Assistant:

basic_substring first_non_empty_span() const
    {
        constexpr const ro_substr empty_chars(" \n\r\t");
        size_t pos = first_not_of(empty_chars);
        if(pos == npos)
            return first(0);
        auto ret = sub(pos);
        pos = ret.first_of(empty_chars);
        return ret.first(pos);
    }